

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

quicly_stream_t * quicly_get_stream(quicly_conn_t *conn,quicly_stream_id_t stream_id)

{
  kh_quicly_stream_t_t *h;
  khint_t kVar1;
  quicly_stream_t *pqVar2;
  
  h = conn->streams;
  kVar1 = kh_get_quicly_stream_t(h,stream_id);
  if (kVar1 == h->n_buckets) {
    pqVar2 = (quicly_stream_t *)0x0;
  }
  else {
    pqVar2 = h->vals[kVar1];
  }
  return pqVar2;
}

Assistant:

quicly_stream_t *quicly_get_stream(quicly_conn_t *conn, quicly_stream_id_t stream_id)
{
    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream_id);
    if (iter != kh_end(conn->streams))
        return kh_val(conn->streams, iter);
    return NULL;
}